

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_bound(REF_DBL *m1,REF_DBL *m2,REF_DBL *m12)

{
  double dVar1;
  REF_INT i;
  uint uVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  REF_DBL m12bar_system [12];
  REF_DBL m1neghalf [6];
  REF_DBL m2bar [6];
  REF_DBL m1half [6];
  REF_DBL m12bar [6];
  undefined8 local_178;
  double local_148;
  double local_140;
  double local_138;
  REF_DBL local_e8 [6];
  REF_DBL local_b8 [6];
  REF_DBL local_88 [6];
  REF_DBL local_58 [6];
  
  uVar2 = ref_matrix_diag_m(m1,&local_148);
  if (uVar2 == 0) {
    uVar4 = SUB84(local_138,0);
    uVar5 = (undefined4)((ulong)local_138 >> 0x20);
    if (((local_148 < 0.0) || (local_140 < 0.0)) || (local_138 < 0.0)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x240,"ref_matrix_sqrt_abs_m","ABS(eigenvalues)");
      printf("eigs %24.15e %24.15e %24.15e\n",SUB84(local_148,0),local_140,uVar4);
      ref_matrix_show_m(m1);
    }
    if (local_148 <= -local_148) {
      local_148 = -local_148;
    }
    dVar6 = local_140;
    if (local_140 <= -local_140) {
      dVar6 = -local_140;
    }
    if (local_138 <= -local_138) {
      uVar5 = (undefined4)((ulong)-local_138 >> 0x20);
    }
    local_138 = (double)CONCAT44(uVar5,uVar4);
    local_178 = (double)CONCAT44(uVar5,uVar4);
    local_140 = dVar6;
    if (local_148 < 0.0) {
      dVar7 = sqrt(local_148);
    }
    else {
      dVar7 = SQRT(local_148);
    }
    local_148 = dVar7;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    local_140 = dVar6;
    if (local_178 < 0.0) {
      local_178 = sqrt(local_178);
    }
    else {
      local_178 = SQRT(local_178);
    }
    local_138 = local_178;
    ref_matrix_form_m(&local_148,local_88);
    dVar1 = dVar7 * 1e+20;
    if (dVar1 <= -dVar1) {
      dVar1 = -dVar1;
    }
    uVar2 = 4;
    if (1.0 < dVar1) {
      local_148 = 1.0 / dVar7;
      dVar7 = dVar6 * 1e+20;
      if (dVar7 <= -dVar7) {
        dVar7 = -dVar7;
      }
      if (1.0 < dVar7) {
        local_140 = 1.0 / dVar6;
        dVar6 = local_178 * 1e+20;
        if (dVar6 <= -dVar6) {
          dVar6 = -dVar6;
        }
        if (1.0 < dVar6) {
          local_138 = 1.0 / local_178;
          ref_matrix_form_m(&local_148,local_e8);
          uVar2 = 0;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x23d,
           "ref_matrix_sqrt_abs_m",(ulong)uVar2,"diag");
    ref_matrix_show_m(m1);
  }
  if (uVar2 == 0) {
    ref_matrix_mult_m0m1m0(local_e8,m2,local_b8);
    uVar2 = ref_matrix_diag_m(local_b8,&local_148);
    if (uVar2 == 0) {
      uVar4 = 0;
      uVar5 = 0x3ff00000;
      dVar6 = 1.0;
      if (local_148 <= 1.0) {
        dVar6 = local_148;
      }
      dVar7 = 1.0;
      if (local_140 <= 1.0) {
        dVar7 = local_140;
      }
      if (local_138 <= 1.0) {
        uVar4 = SUB84(local_138,0);
        uVar5 = (undefined4)((ulong)local_138 >> 0x20);
      }
      local_138 = (double)CONCAT44(uVar5,uVar4);
      local_148 = dVar6;
      local_140 = dVar7;
      ref_matrix_form_m(&local_148,local_58);
      ref_matrix_mult_m0m1m0(local_88,local_58,m12);
      uVar2 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x2f1,"ref_matrix_bound",(ulong)uVar2,"diag m12bar");
      puts("m1");
      ref_matrix_show_m(m1);
      puts("m2");
      ref_matrix_show_m(m2);
      puts("m2bar");
      ref_matrix_show_m(local_b8);
      puts("m1neghalf");
      ref_matrix_show_m(local_e8);
    }
  }
  else if (uVar2 == 4) {
    uVar2 = 0;
    lVar3 = 0;
    do {
      m12[lVar3] = m2[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x2e0,
           "ref_matrix_bound","ref_matrix_sqrt_m failed");
    puts("m1");
    ref_matrix_show_m(m1);
    puts("m2");
    ref_matrix_show_m(m2);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_bound(REF_DBL *m1, REF_DBL *m2, REF_DBL *m12) {
  REF_DBL m1half[6];
  REF_DBL m1neghalf[6];
  REF_DBL m2bar[6];
  REF_DBL m12bar[6];
  REF_DBL m12bar_system[12];
  REF_STATUS sqrt_m1_status;
  sqrt_m1_status = ref_matrix_sqrt_abs_m(m1, m1half, m1neghalf);
  if (REF_DIV_ZERO == sqrt_m1_status) {
    REF_INT i;
    for (i = 0; i < 6; i++) m12[i] = m2[i];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS != sqrt_m1_status) {
    REF_WHERE("ref_matrix_sqrt_m failed");
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    return sqrt_m1_status;
  }
  RSS(ref_matrix_mult_m0m1m0(m1neghalf, m2, m2bar), "m2bar=m1half*m2*m1half");
  RSB(ref_matrix_diag_m(m2bar, m12bar_system), "diag m12bar", {
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    printf("m2bar\n");
    ref_matrix_show_m(m2bar);
    printf("m1neghalf\n");
    ref_matrix_show_m(m1neghalf);
  });
  ref_matrix_eig(m12bar_system, 0) = MIN(1.0, ref_matrix_eig(m12bar_system, 0));
  ref_matrix_eig(m12bar_system, 1) = MIN(1.0, ref_matrix_eig(m12bar_system, 1));
  ref_matrix_eig(m12bar_system, 2) = MIN(1.0, ref_matrix_eig(m12bar_system, 2));

  RSS(ref_matrix_form_m(m12bar_system, m12bar), "form m12bar");

  RSS(ref_matrix_mult_m0m1m0(m1half, m12bar, m12), "m12=m1half*m12bar*m1half");

  return REF_SUCCESS;
}